

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall
ncnn::ModelBinFromMatArray::load(ModelBinFromMatArray *this,int param_2,int param_3)

{
  long in_RSI;
  Mat *in_RDI;
  Mat *m;
  
  if (**(long **)(in_RSI + 8) == 0) {
    ncnn::Mat::Mat(in_RDI);
  }
  else {
    ncnn::Mat::Mat(in_RDI,in_RDI);
    **(long **)(in_RSI + 8) = **(long **)(in_RSI + 8) + 0x48;
  }
  return in_RDI;
}

Assistant:

Mat ModelBinFromMatArray::load(int /*w*/, int /*type*/) const
{
    if (!d->weights)
        return Mat();

    Mat m = d->weights[0];
    d->weights++;
    return m;
}